

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QRectF * __thiscall BorderPaginator::clipRect(BorderPaginator *this,int page)

{
  double *pdVar1;
  int in_EDX;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar2;
  qreal qVar3;
  QRectF clipped;
  QRectF *r;
  QRectF *in_stack_ffffffffffffffa8;
  qreal local_50;
  double local_48;
  qreal local_40;
  QRect local_38;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  local_28.w = -NAN;
  local_28.h = -NAN;
  r = in_RDI;
  local_38 = QRectF::toRect(in_stack_ffffffffffffffa8);
  QRectF::QRectF(in_RSI,(QRect *)r);
  if (*(int *)&in_RSI->yp != *(int *)((long)&in_RSI->yp + 4)) {
    local_40 = QRectF::top(&local_28);
    local_48 = ((double)in_EDX * in_RSI->xp + in_RSI[1].w) - in_RSI[2].xp;
    pdVar1 = qMax<double>(&local_40,&local_48);
    QRectF::setTop(&local_28,*pdVar1);
    local_50 = QRectF::bottom(&local_28);
    pdVar1 = qMin<double>(&local_50,(double *)&stack0xffffffffffffffa8);
    QRectF::setBottom(&local_28,*pdVar1);
    qVar2 = QRectF::bottom(&local_28);
    qVar3 = QRectF::top(&local_28);
    if (qVar2 <= qVar3) {
      QRectF::QRectF(in_RDI);
      goto LAB_00813185;
    }
  }
  in_RDI->xp = local_28.xp;
  in_RDI->yp = local_28.yp;
  in_RDI->w = local_28.w;
  in_RDI->h = local_28.h;
LAB_00813185:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return r;
}

Assistant:

QRectF clipRect(int page) const
    {
        QRectF clipped = rect.toRect();

        if (topPage != bottomPage) {
            clipped.setTop(qMax(clipped.top(), page * pageHeight + topMarginAfterPageBreak - border));
            clipped.setBottom(qMin(clipped.bottom(), (page + 1) * pageHeight - bottomMargin));

            if (clipped.bottom() <= clipped.top())
                return QRectF();
        }

        return clipped;
    }